

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# inflate.c
# Opt level: O0

int inflateReset(z_streamp strm)

{
  internal_state *piVar1;
  internal_state *piVar2;
  inflate_state *state;
  z_streamp strm_local;
  
  if ((strm == (z_streamp)0x0) || (strm->state == (internal_state *)0x0)) {
    strm_local._4_4_ = -2;
  }
  else {
    piVar1 = strm->state;
    *(undefined8 *)(piVar1 + 0x20) = 0;
    strm->total_out = 0;
    strm->total_in = 0;
    strm->msg = (char *)0x0;
    strm->adler = 1;
    *(undefined4 *)piVar1 = 0;
    *(undefined4 *)(piVar1 + 4) = 0;
    *(undefined4 *)(piVar1 + 0xc) = 0;
    *(undefined4 *)(piVar1 + 0x14) = 0x8000;
    *(undefined8 *)(piVar1 + 0x28) = 0;
    *(undefined4 *)(piVar1 + 0x34) = 0;
    *(undefined4 *)(piVar1 + 0x38) = 0;
    *(undefined4 *)(piVar1 + 0x3c) = 0;
    *(undefined8 *)(piVar1 + 0x48) = 0;
    *(undefined4 *)(piVar1 + 0x50) = 0;
    piVar2 = piVar1 + 0x550;
    *(internal_state **)(piVar1 + 0x88) = piVar2;
    *(internal_state **)(piVar1 + 0x68) = piVar2;
    *(internal_state **)(piVar1 + 0x60) = piVar2;
    *(undefined4 *)(piVar1 + 0x1be0) = 1;
    *(undefined4 *)(piVar1 + 0x1be4) = 0xffffffff;
    strm_local._4_4_ = 0;
  }
  return strm_local._4_4_;
}

Assistant:

int ZEXPORT inflateReset(strm)
z_streamp strm;
{
    struct inflate_state FAR *state;

    if (strm == Z_NULL || strm->state == Z_NULL) return Z_STREAM_ERROR;
    state = (struct inflate_state FAR *)strm->state;
    strm->total_in = strm->total_out = state->total = 0;
    strm->msg = Z_NULL;
    strm->adler = 1;        /* to support ill-conceived Java test suite */
    state->mode = HEAD;
    state->last = 0;
    state->havedict = 0;
    state->dmax = 32768U;
    state->head = Z_NULL;
    state->wsize = 0;
    state->whave = 0;
    state->wnext = 0;
    state->hold = 0;
    state->bits = 0;
    state->lencode = state->distcode = state->next = state->codes;
    state->sane = 1;
    state->back = -1;
    Tracev((stderr, "inflate: reset\n"));
    return Z_OK;
}